

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

_Bool duckdb_je_multi_setting_parse_next
                (char **setting_segment_cur,size_t *len_left,size_t *key_start,size_t *key_end,
                size_t *value)

{
  char cVar1;
  char *nptr;
  int iVar2;
  char *in_RAX;
  int *piVar3;
  uintmax_t uVar4;
  _Bool _Var5;
  char *local_38;
  
  nptr = *setting_segment_cur;
  local_38 = in_RAX;
  piVar3 = __errno_location();
  *piVar3 = 0;
  uVar4 = duckdb_je_malloc_strtoumax(nptr,&local_38,0);
  iVar2 = get_errno();
  _Var5 = true;
  if ((iVar2 == 0) && (*local_38 == '-')) {
    *key_start = uVar4;
    uVar4 = duckdb_je_malloc_strtoumax(local_38 + 1,&local_38,0);
    iVar2 = get_errno();
    if ((iVar2 == 0) && (*local_38 == ':')) {
      *key_end = uVar4;
      uVar4 = duckdb_je_malloc_strtoumax(local_38 + 1,&local_38,0);
      iVar2 = get_errno();
      _Var5 = true;
      if (iVar2 == 0) {
        *value = uVar4;
        cVar1 = *local_38;
        *len_left = (size_t)(*setting_segment_cur + (*len_left - (long)(local_38 + (cVar1 == '|'))))
        ;
        *setting_segment_cur = local_38 + (cVar1 == '|');
        _Var5 = false;
      }
    }
    else {
      _Var5 = true;
    }
  }
  return _Var5;
}

Assistant:

bool
multi_setting_parse_next(const char **setting_segment_cur, size_t *len_left,
    size_t *key_start, size_t *key_end, size_t *value) {
	const char *cur = *setting_segment_cur;
	char *end;
	uintmax_t um;

	set_errno(0);

	/* First number, then '-' */
	um = malloc_strtoumax(cur, &end, 0);
	if (get_errno() != 0 || *end != '-') {
		return true;
	}
	*key_start = (size_t)um;
	cur = end + 1;

	/* Second number, then ':' */
	um = malloc_strtoumax(cur, &end, 0);
	if (get_errno() != 0 || *end != ':') {
		return true;
	}
	*key_end = (size_t)um;
	cur = end + 1;

	/* Last number */
	um = malloc_strtoumax(cur, &end, 0);
	if (get_errno() != 0) {
		return true;
	}
	*value = (size_t)um;

	/* Consume the separator if there is one. */
	if (*end == '|') {
		end++;
	}

	*len_left -= end - *setting_segment_cur;
	*setting_segment_cur = end;

	return false;
}